

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O1

void __thiscall
LibGens::Ym2612Private::T_Update_Chan_LFO_Int<4>
          (Ym2612Private *this,channel_t *CH,int32_t *bufL,int32_t *bufR,int length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  
  if ((CH->_SLOT[2].Ecnt != 0x20000000 || CH->_SLOT[3].Ecnt != 0x20000000) &&
     (this->int_cnt = (this->state).Inter_Cnt, 0 < length)) {
    iVar21 = 0;
    do {
      iVar20 = CH->_SLOT[0].Fcnt;
      uVar19 = CH->_SLOT[1].Fcnt;
      iVar22 = CH->_SLOT[2].Fcnt;
      uVar15 = this->LFO_FREQ_UP[iVar21] * CH->FMS;
      if (uVar15 < 0x200) {
        CH->_SLOT[0].Fcnt = CH->_SLOT[0].Finc + iVar20;
        CH->_SLOT[2].Fcnt = CH->_SLOT[2].Finc + iVar22;
        CH->_SLOT[1].Fcnt = CH->_SLOT[1].Finc + uVar19;
        iVar17 = CH->_SLOT[3].Finc;
      }
      else {
        iVar16 = (int)uVar15 >> 9;
        iVar17 = CH->_SLOT[0].Finc;
        iVar1 = CH->_SLOT[1].Finc;
        CH->_SLOT[0].Fcnt = iVar17 + iVar20 + (iVar17 * iVar16 >> 9);
        iVar17 = CH->_SLOT[2].Finc;
        CH->_SLOT[2].Fcnt = iVar17 + iVar22 + (iVar17 * iVar16 >> 9);
        CH->_SLOT[1].Fcnt = (iVar1 * iVar16 >> 9) + uVar19 + iVar1;
        iVar17 = CH->_SLOT[3].Finc;
        iVar17 = (iVar16 * iVar17 >> 9) + iVar17;
      }
      iVar1 = CH->_SLOT[3].Fcnt;
      CH->_SLOT[3].Fcnt = iVar17 + iVar1;
      iVar17 = this->LFO_ENV_UP[iVar21];
      iVar16 = CH->_SLOT[0].TLL;
      iVar18 = CH->_SLOT[0].Ecnt;
      iVar2 = (&ENV_TAB)[iVar18 >> 0x10];
      iVar10 = CH->_SLOT[0].AMS;
      iVar3 = CH->_SLOT[2].TLL;
      iVar11 = CH->_SLOT[2].AMS;
      iVar4 = (&ENV_TAB)[*(short *)((long)&CH->_SLOT[2].Ecnt + 2)];
      iVar5 = CH->_SLOT[1].TLL;
      iVar6 = (&ENV_TAB)[*(short *)((long)&CH->_SLOT[1].Ecnt + 2)];
      iVar12 = CH->_SLOT[1].AMS;
      iVar7 = CH->_SLOT[3].TLL;
      iVar13 = CH->_SLOT[3].AMS;
      iVar8 = (&ENV_TAB)[*(short *)((long)&CH->_SLOT[3].Ecnt + 2)];
      iVar18 = iVar18 + CH->_SLOT[0].Einc;
      CH->_SLOT[0].Ecnt = iVar18;
      if (CH->_SLOT[0].Ecmp <= iVar18) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[0].Ecurp * 8))(CH->_SLOT);
      }
      iVar18 = CH->_SLOT[2].Ecnt + CH->_SLOT[2].Einc;
      CH->_SLOT[2].Ecnt = iVar18;
      if (CH->_SLOT[2].Ecmp <= iVar18) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[2].Ecurp * 8))(CH->_SLOT + 2);
      }
      iVar18 = CH->_SLOT[1].Ecnt + CH->_SLOT[1].Einc;
      CH->_SLOT[1].Ecnt = iVar18;
      if (CH->_SLOT[1].Ecmp <= iVar18) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[1].Ecurp * 8))(CH->_SLOT + 1);
      }
      iVar18 = CH->_SLOT[3].Ecnt + CH->_SLOT[3].Einc;
      CH->_SLOT[3].Ecnt = iVar18;
      if (CH->_SLOT[3].Ecmp <= iVar18) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[3].Ecurp * 8))(CH->_SLOT + 3);
      }
      iVar18 = CH->S0_OUT[0];
      iVar9 = CH->S0_OUT[1];
      iVar14 = CH->FB;
      CH->S0_OUT[1] = iVar18;
      iVar20 = *(int *)(*(long *)(SIN_TAB +
                                 ((uint)((iVar9 + iVar18 >> ((byte)iVar14 & 0x1f)) + iVar20) >> 0xb
                                 & 0x7ff8)) +
                       (long)(iVar16 + iVar2 + (iVar17 >> ((byte)iVar10 & 0x1f))) * 4);
      CH->S0_OUT[0] = iVar20;
      iVar22 = *(int *)(*(long *)(SIN_TAB + ((uint)(iVar22 + iVar20) >> 0xb & 0x7ff8)) +
                       (long)(iVar3 + iVar4 + (iVar17 >> ((byte)iVar11 & 0x1f))) * 4) +
               *(int *)(*(long *)(SIN_TAB +
                                 ((uint)(iVar1 + *(int *)(*(long *)(SIN_TAB +
                                                                   (uVar19 >> 0xb & 0x7ff8)) +
                                                         (long)(iVar5 + iVar6 +
                                                               (iVar17 >> ((byte)iVar12 & 0x1f))) *
                                                         4)) >> 0xb & 0x7ff8)) +
                       (long)(iVar7 + iVar8 + (iVar17 >> ((byte)iVar13 & 0x1f))) * 4) >> 0xe;
      CH->OUTd = iVar22;
      iVar20 = LIMIT_CH_OUT;
      if ((LIMIT_CH_OUT < iVar22) ||
         (iVar20 = -LIMIT_CH_OUT, SBORROW4(iVar22,-LIMIT_CH_OUT) != iVar22 + LIMIT_CH_OUT < 0)) {
        CH->OUTd = iVar20;
      }
      uVar19 = this->int_cnt + (this->state).Inter_Step;
      this->int_cnt = uVar19;
      if ((uVar19 >> 0xe & 1) != 0) {
        uVar19 = uVar19 & 0x3fff;
        this->int_cnt = uVar19;
        iVar20 = (int)(uVar19 * CH->Old_OUTd + (uVar19 ^ 0x3fff) * CH->OUTd) >> 0xe;
        CH->Old_OUTd = iVar20;
        bufL[iVar21] = bufL[iVar21] + ((iVar20 * CH->PANVolumeL) / 0xffff & CH->LEFT);
        bufR[iVar21] = bufR[iVar21] + ((CH->PANVolumeR * CH->Old_OUTd) / 0xffff & CH->RIGHT);
        iVar21 = iVar21 + 1;
      }
      CH->Old_OUTd = CH->OUTd;
    } while (iVar21 < length);
  }
  return;
}

Assistant:

inline void Ym2612Private::T_Update_Chan_LFO_Int(channel_t *CH, int32_t *bufL, int32_t *bufR, int length)
{
	// Check if the channel has reached the end of the update.
	{
		int not_end = (CH->_SLOT[S3].Ecnt - ENV_END);

		// Special cases.
		// Copied from Game_Music_Emu v0.5.2.
		if (algo == 7)
			not_end |= (CH->_SLOT[S0].Ecnt - ENV_END);
		if (algo >= 5)
			not_end |= (CH->_SLOT[S2].Ecnt - ENV_END);
		if (algo >= 4)
			not_end |= (CH->_SLOT[S1].Ecnt - ENV_END);

		if (not_end == 0)
			return;
	}

	int_cnt = state.Inter_Cnt;
	int env_LFO, freq_LFO;

//	LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG2,
//		"Algo %d LFO Int len = %d", algo, length);

	for (int i = 0; i < length; i++) {
		int in0, in1, in2, in3;		// current phase calculation
		int en0, en1, en2, en3;		// current envelope calculation

		GET_CURRENT_PHASE();
		UPDATE_PHASE_LFO();
		GET_CURRENT_ENV_LFO();
		UPDATE_ENV();

		assert(algo >= 0 && algo <= 7);
		switch (algo) {
			case 0:
				DO_ALGO_0();
				break;
			case 1:
				DO_ALGO_1();
				break;
			case 2:
				DO_ALGO_2();
				break;
			case 3:
				DO_ALGO_3();
				break;
			case 4:
				DO_ALGO_4();
				break;
			case 5:
				DO_ALGO_5();
				break;
			case 6:
				DO_ALGO_6();
				break;
			case 7:
				DO_ALGO_7();
				break;
			default:
				break;
		}

		DO_OUTPUT_INT();
	}
}